

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O0

OPJ_OFF_T opj_stream_read_skip
                    (opj_stream_private_t *p_stream,OPJ_OFF_T p_size,opj_event_mgr_t *p_event_mgr)

{
  long lVar1;
  opj_event_mgr_t *in_RDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  OPJ_OFF_T l_current_skip_nb_bytes;
  OPJ_OFF_T l_skip_nb_bytes;
  ulong local_40;
  ulong local_38;
  ulong local_28;
  ulong local_18;
  ulong local_8;
  
  local_28 = 0;
  if ((long)(ulong)*(uint *)(in_RDI + 10) < (long)in_RSI) {
    if ((*(uint *)((long)in_RDI + 100) & 4) == 0) {
      local_18 = in_RSI;
      if (*(int *)(in_RDI + 10) != 0) {
        local_28 = (ulong)*(uint *)(in_RDI + 10);
        in_RDI[7] = in_RDI[6];
        local_18 = in_RSI - *(uint *)(in_RDI + 10);
        *(undefined4 *)(in_RDI + 10) = 0;
      }
      for (; 0 < (long)local_18; local_18 = local_18 - lVar1) {
        lVar1 = (*(code *)in_RDI[4])(local_18,*in_RDI);
        if (lVar1 == -1) {
          opj_event_msg_v2(in_RDX,4,"Stream reached its end !\n");
          *(uint *)((long)in_RDI + 100) = *(uint *)((long)in_RDI + 100) | 4;
          in_RDI[0xb] = local_28 + in_RDI[0xb];
          if (local_28 == 0) {
            local_40 = 0xffffffffffffffff;
          }
          else {
            local_40 = local_28;
          }
          return local_40;
        }
        local_28 = lVar1 + local_28;
      }
      in_RDI[0xb] = local_28 + in_RDI[0xb];
      local_8 = local_28;
    }
    else {
      local_38 = (ulong)*(uint *)(in_RDI + 10);
      in_RDI[7] = in_RDI[7] + (ulong)*(uint *)(in_RDI + 10);
      *(undefined4 *)(in_RDI + 10) = 0;
      in_RDI[0xb] = local_38 + in_RDI[0xb];
      if (local_38 == 0) {
        local_38 = 0xffffffffffffffff;
      }
      local_8 = local_38;
    }
  }
  else {
    in_RDI[7] = in_RSI + in_RDI[7];
    *(int *)(in_RDI + 10) = *(int *)(in_RDI + 10) - (int)in_RSI;
    in_RDI[0xb] = in_RSI + in_RDI[0xb];
    local_8 = in_RSI;
  }
  return local_8;
}

Assistant:

OPJ_OFF_T opj_stream_read_skip (opj_stream_private_t * p_stream, OPJ_OFF_T p_size, opj_event_mgr_t * p_event_mgr)
{
	OPJ_OFF_T l_skip_nb_bytes = 0;
	OPJ_OFF_T l_current_skip_nb_bytes = 0;

	if
		(p_stream->m_bytes_in_buffer >= p_size)
	{
		p_stream->m_current_data += p_size;
		// it is safe to cast p_size to OPJ_SIZE_T since it is <= m_bytes_in_buffer
		// which is of type OPJ_SIZE_T
		p_stream->m_bytes_in_buffer -= (OPJ_SIZE_T)p_size;
		l_skip_nb_bytes += p_size;
		p_stream->m_byte_offset += l_skip_nb_bytes;
		return l_skip_nb_bytes;
	}

	// we are now in the case when the remaining data if not sufficient
	if
		(p_stream->m_status & opj_stream_e_end)
	{
		l_skip_nb_bytes += p_stream->m_bytes_in_buffer;
		p_stream->m_current_data += p_stream->m_bytes_in_buffer;
		p_stream->m_bytes_in_buffer = 0;
		p_stream->m_byte_offset += l_skip_nb_bytes;
		return l_skip_nb_bytes ? l_skip_nb_bytes : (OPJ_OFF_T) -1;
	}

	// the flag is not set, we copy data and then do an actual skip on the stream
	if
		(p_stream->m_bytes_in_buffer)
	{
		l_skip_nb_bytes += p_stream->m_bytes_in_buffer;
		p_stream->m_current_data = p_stream->m_stored_data;
		p_size -= p_stream->m_bytes_in_buffer;
		p_stream->m_bytes_in_buffer = 0;
	}

	while
		(p_size > 0)
	{
		// we should do an actual skip on the media
		l_current_skip_nb_bytes = p_stream->m_skip_fn(p_size, p_stream->m_user_data);
		if
			(l_current_skip_nb_bytes == (OPJ_OFF_T) -1)
		{
			opj_event_msg_v2(p_event_mgr, EVT_INFO, "Stream reached its end !\n");

			p_stream->m_status |= opj_stream_e_end;
			p_stream->m_byte_offset += l_skip_nb_bytes;
			// end if stream
			return l_skip_nb_bytes ? l_skip_nb_bytes : (OPJ_OFF_T) -1;
		}
		p_size -= l_current_skip_nb_bytes;
		l_skip_nb_bytes += l_current_skip_nb_bytes;
	}
	p_stream->m_byte_offset += l_skip_nb_bytes;
	return l_skip_nb_bytes;
}